

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::count_digits<3u>
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  uVar3 = this->abs_value;
  do {
    iVar2 = iVar2 + 1;
    bVar1 = 7 < uVar3;
    uVar3 = uVar3 >> 3;
  } while (bVar1);
  return iVar2;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }